

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O3

void __thiscall
deqp::gls::StateChangePerformanceCase::requireFramebuffers
          (StateChangePerformanceCase *this,int count)

{
  iterator __position;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  uint *puVar5;
  GLuint framebuffer;
  uint local_40;
  int local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  long lVar4;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((int)((ulong)((long)(this->m_framebuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_framebuffers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    local_3c = count;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_framebuffers,(long)count);
    requireRenderbuffers(this,count);
    local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_framebuffers;
    if ((int)((ulong)((long)(this->m_framebuffers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->m_framebuffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < count) {
      do {
        (**(code **)(lVar4 + 0x6d0))(1,&local_40);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glGenFramebuffers()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x189);
        (**(code **)(lVar4 + 0x78))(0x8d40,local_40);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glBindFramebuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x18c);
        (**(code **)(lVar4 + 0xa0))
                  (0x8d41,*(undefined4 *)
                           ((long)(this->m_framebuffers).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                           ((long)(this->m_renderbuffers).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start -
                           (long)(this->m_framebuffers).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glBindRenderbuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,399);
        (**(code **)(lVar4 + 0x688))
                  (0x8d40,0x8ce0,0x8d41,
                   *(undefined4 *)
                    ((long)(this->m_framebuffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                    ((long)(this->m_renderbuffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start -
                    (long)(this->m_framebuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start)));
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glFramebufferRenderbuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x192);
        (**(code **)(lVar4 + 0xa0))(0x8d41,0);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glBindRenderbuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x195);
        (**(code **)(lVar4 + 0x78))(0x8d40,0);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glBindFramebuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x198);
        pvVar1 = local_38;
        __position._M_current =
             (this->m_framebuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_framebuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_38,__position,&local_40);
          puVar5 = (this->m_framebuffers).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = local_40;
          puVar5 = __position._M_current + 1;
          (this->m_framebuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar5;
        }
      } while ((int)((ulong)((long)puVar5 - *(long *)pvVar1) >> 2) < local_3c);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireFramebuffers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_framebuffers.size() >= count)
		return;

	m_framebuffers.reserve(count);

	requireRenderbuffers(count);

	while ((int)m_framebuffers.size() < count)
	{
		GLuint framebuffer;

		gl.genFramebuffers(1, &framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers()");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer()");

		gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffers[m_framebuffers.size()]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer()");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_renderbuffers[m_framebuffers.size()]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer()");

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer()");

		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer()");

		m_framebuffers.push_back(framebuffer);
	}
}